

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTimer.h
# Opt level: O2

double __thiscall HTimer::getWallTime(HTimer *this)

{
  timeval tv;
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  return (double)local_18.tv_usec / 1000000.0 + (double)local_18.tv_sec;
}

Assistant:

double getWallTime() {
        double walltime;
        struct timeval tv;
        gettimeofday(&tv, NULL);
        walltime = tv.tv_sec;
        walltime += (double) tv.tv_usec / 1000000.0;
        return walltime;
    }